

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerBase::SetEnumerable
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  int *piVar1;
  bool bVar2;
  PropertyIndex propertyIndex;
  int iVar3;
  BOOL BVar4;
  DynamicTypeHandler *pDVar5;
  PropertyRecord *pPVar6;
  undefined4 extraout_var;
  
  if (value != 0) {
    return 1;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ShareTypesWithAttributesPhase);
  if (bVar2) {
    piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->
              convertPathToDictionaryAttributesCount;
    *piVar1 = *piVar1 + 1;
    pDVar5 = TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                       (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),
                        false);
  }
  else {
    propertyIndex =
         TypePath::LookupInline
                   ((this->typePath).ptr,propertyId,
                    (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
    if (propertyIndex != 0xffff) {
      BVar4 = SetAttributesHelper(this,instance,propertyId,propertyIndex,(ObjectSlotAttributes *)0x0
                                  ,ObjectSlotAttr_Writable|ObjectSlotAttr_Configurable,false);
      return BVar4;
    }
    bVar2 = DynamicObject::HasObjectArray(instance);
    if (!bVar2) {
      return 1;
    }
    pPVar6 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    if (pPVar6->isNumeric != true) {
      return 1;
    }
    iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,instance);
    pDVar5 = (DynamicTypeHandler *)CONCAT44(extraout_var,iVar3);
  }
  iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x29])
                    (pDVar5,instance,(ulong)(uint)propertyId,0,
                     pDVar5->_vptr_DynamicTypeHandler[0x29]);
  return iVar3;
}

Assistant:

BOOL PathTypeHandlerBase::SetEnumerable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (value)
        {
            return true;
        }

        if (PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif
            return TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetEnumerable(instance, propertyId, value);
        }

        // Find the property
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray())
            {
                PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                if (propertyRecord->IsNumeric())
                {
                    return ConvertToTypeWithItemAttributes(instance)->SetEnumerable(instance, propertyId, value);
                }
            }
            return true;
        }

        return SetAttributesHelper(instance, propertyId, propertyIndex, nullptr, (ObjectSlotAttributes)(ObjectSlotAttr_Default & ~ObjectSlotAttr_Enumerable));
    }